

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solverational.hpp
# Opt level: O3

void __thiscall
soplex::SoPlexBase<double>::_optimizeRational(SoPlexBase<double> *this,bool *interrupt)

{
  SPxSolverBase<double> *pSVar1;
  undefined1 *puVar2;
  SPxStatus SVar3;
  bool bVar4;
  Settings *pSVar5;
  SPxStatus SVar6;
  Verbosity old_verbosity;
  Status SVar7;
  Verbosity old_verbosity_3;
  Verbosity VVar8;
  SolRational *sol;
  byte bVar9;
  byte bVar10;
  double dVar11;
  bool error;
  bool stoppedIter;
  bool hasUnboundedRay;
  bool infeasible;
  bool stoppedTime;
  bool unbounded;
  bool dualFeasible;
  bool primalFeasible;
  SPxOut *local_150;
  int local_148;
  uint local_144;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_140;
  SolRational *local_138;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_130;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  *local_128;
  SPxSolverBase<double> *local_120;
  SolRational solUnbounded;
  
  hasUnboundedRay = false;
  (*this->_statistics->solvingTime->_vptr_Timer[3])();
  (*this->_statistics->preprocessingTime->_vptr_Timer[3])();
  (*this->_statistics->initialPrecisionTime->_vptr_Timer[3])();
  this->_lastSolveMode = 2;
  this->_statistics->precBoosts = 0;
  if (this->_isRealLPLoaded == false) {
    SPxSolverBase<double>::loadLP(&this->_solver,this->_realLP,true);
    free(this->_realLP);
    this->_realLP = &(this->_solver).super_SPxLPBase<double>;
    this->_isRealLPLoaded = true;
  }
  else if (this->_hasBasis == true) {
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              (&this->_basisStatusRows,
               (this->_realLP->super_LPRowSetBase<double>).super_SVSetBase<double>.set.thenum);
    DataArray<soplex::SPxSolverBase<double>::VarStatus>::reSize
              (&this->_basisStatusCols,
               (this->_realLP->super_LPColSetBase<double>).super_SVSetBase<double>.set.thenum);
    SPxSolverBase<double>::getBasis
              (&this->_solver,(this->_basisStatusRows).data,(this->_basisStatusCols).data,
               (this->_basisStatusRows).thesize,(this->_basisStatusCols).thesize);
  }
  _storeLPReal(this);
  pSVar5 = this->_currentSettings;
  dVar11 = pSVar5->_realParamValues[6];
  if (((-dVar11 < pSVar5->_realParamValues[8]) ||
      (pSVar5->_realParamValues[9] <= dVar11 && dVar11 != pSVar5->_realParamValues[9])) &&
     (VVar8 = (this->spxout).m_verbosity, 3 < (int)VVar8)) {
    (this->spxout).m_verbosity = INFO2;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[4],"Deactivating objective limit.\n",0x1e);
    (this->spxout).m_verbosity = VVar8;
    dVar11 = this->_currentSettings->_realParamValues[6];
  }
  (this->_solver).objLimit = dVar11;
  (*this->_statistics->preprocessingTime->_vptr_Timer[4])();
  pSVar5 = this->_currentSettings;
  if (pSVar5->_boolParamValues[0] == true) {
    _lift(this);
    pSVar5 = this->_currentSettings;
  }
  local_144 = pSVar5->_intParamValues[1];
  if ((DAT_006aa534 < 2) && (0 < DAT_006aa5a4)) {
    pSVar5->_intParamValues[1] = 1;
  }
  pSVar1 = &this->_solver;
  local_148 = pSVar5->_intParamValues[0xe];
  if (((local_148 == 3) && (DAT_006aa568 < 3)) && (1 < DAT_006aa5d8)) {
    SPxSolverBase<double>::setTester
              (pSVar1,&(this->_ratiotesterFast).super_SPxRatioTester<double>,false);
    pSVar5 = this->_currentSettings;
    pSVar5->_intParamValues[0xe] = 2;
  }
  local_120 = pSVar1;
  if (pSVar5->_boolParamValues[1] == true) {
    _transformEquality(this);
  }
  this->_storedBasis = false;
  sol = &this->_solRational;
  local_140 = &(this->_solRational)._primalRay;
  local_150 = &this->spxout;
  local_128 = &(this->_solRational)._dual;
  local_130 = &(this->_solRational)._redCost;
  bVar10 = 0;
  bVar9 = 0;
  local_138 = sol;
  while( true ) {
    primalFeasible = false;
    dualFeasible = false;
    infeasible = false;
    unbounded = false;
    error = false;
    stoppedTime = false;
    stoppedIter = false;
    this->_certificateMode = 0;
    _performOptIRWrapper
              (this,sol,(bool)(~bVar10 & 1),(bool)(~bVar9 & 1),0,&primalFeasible,&dualFeasible,
               &infeasible,&unbounded,&stoppedTime,&stoppedIter,&error);
    if (error == true) {
      this->_status = ERROR;
      goto LAB_00315115;
    }
    if (stoppedTime == true) {
      this->_status = ABORT_TIME;
      goto LAB_00315115;
    }
    if (stoppedIter == true) {
      this->_status = ABORT_ITER;
      goto LAB_00315115;
    }
    if (((bVar10 & 1) == 0) && (unbounded != false)) break;
    if (((bVar9 & 1) != 0) || (infeasible == false)) {
      if ((primalFeasible == true) && (dualFeasible == true)) {
        VVar8 = (this->spxout).m_verbosity;
        if (2 < (int)VVar8) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Solved to optimality.\n",0x16);
          (this->spxout).m_verbosity = VVar8;
        }
        this->_status = OPTIMAL;
      }
      else {
        VVar8 = (this->spxout).m_verbosity;
        if (2 < (int)VVar8) {
          (this->spxout).m_verbosity = INFO1;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((this->spxout).m_streams[3],"Terminating without success.\n",0x1d);
          (this->spxout).m_verbosity = VVar8;
        }
      }
      goto LAB_00315115;
    }
    _storeBasis(this);
    this->_certificateMode = 1;
    _performFeasIRStable(this,sol,&infeasible,&stoppedTime,&stoppedIter,&error);
    bVar4 = infeasible;
    if (error == true) {
      VVar8 = (this->spxout).m_verbosity;
      if (2 < (int)VVar8) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Error while testing for infeasibility.\n",0x27);
        (this->spxout).m_verbosity = VVar8;
      }
      this->_status = ERROR;
LAB_0031500d:
      _restoreBasis(this);
      goto LAB_00315115;
    }
    if (stoppedTime == true) {
      this->_status = ABORT_TIME;
      goto LAB_0031500d;
    }
    if (stoppedIter == true) {
      this->_status = ABORT_ITER;
      goto LAB_0031500d;
    }
    if ((infeasible != false) && (this->_currentSettings->_boolParamValues[2] == true)) {
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::SolBase(&solUnbounded);
      this->_certificateMode = 2;
      _performUnboundedIRStable
                (this,&solUnbounded,&hasUnboundedRay,&stoppedTime,&stoppedIter,&error);
      if (error == true) {
        VVar8 = (this->spxout).m_verbosity;
        if (2 < (int)VVar8) {
          (this->spxout).m_verbosity = INFO1;
          soplex::operator<<(local_150,"Error while testing for dual infeasibility.\n");
          (this->spxout).m_verbosity = VVar8;
        }
        this->_status = ERROR;
        _restoreBasis(this);
        SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::~SolBase(&solUnbounded);
        goto LAB_00315115;
      }
      if (hasUnboundedRay == true) {
        VVar8 = (this->spxout).m_verbosity;
        if (2 < (int)VVar8) {
          (this->spxout).m_verbosity = INFO1;
          soplex::operator<<(local_150,"Dual infeasible.  Primal unbounded ray available.\n");
          (this->spxout).m_verbosity = VVar8;
        }
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator=(local_140,&solUnbounded._primalRay);
        puVar2 = &(this->_solRational).field_0xd0;
        *puVar2 = *puVar2 | 2;
      }
      else {
        VVar8 = (this->spxout).m_verbosity;
        if ((solUnbounded._208_1_ & 4) == 0) {
          if (2 < (int)VVar8) {
            (this->spxout).m_verbosity = INFO1;
            soplex::operator<<(local_150,"Not dual infeasible.\n");
            (this->spxout).m_verbosity = VVar8;
          }
        }
        else {
          if (2 < (int)VVar8) {
            (this->spxout).m_verbosity = INFO1;
            soplex::operator<<(local_150,"Dual feasible.  Storing dual multipliers.\n");
            (this->spxout).m_verbosity = VVar8;
          }
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=(local_128,&solUnbounded._dual);
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=(local_130,&solUnbounded._redCost);
          puVar2 = &(this->_solRational).field_0xd0;
          *puVar2 = *puVar2 | 4;
        }
      }
      SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
      ::~SolBase(&solUnbounded);
    }
    _restoreBasis(this);
    if (infeasible == true) {
      VVar8 = (this->spxout).m_verbosity;
      if (2 < (int)VVar8) {
        (this->spxout).m_verbosity = INFO1;
        soplex::operator<<(local_150,"Primal infeasible.  Dual Farkas ray available.\n");
        (this->spxout).m_verbosity = VVar8;
      }
      this->_status = INFEASIBLE;
      goto LAB_00315115;
    }
    VVar8 = (this->spxout).m_verbosity;
    if (hasUnboundedRay == true) {
      if (2 < (int)VVar8) {
        (this->spxout).m_verbosity = INFO1;
        soplex::operator<<(local_150,"Primal feasible and unbounded.\n");
        (this->spxout).m_verbosity = VVar8;
      }
      this->_status = UNBOUNDED;
      goto LAB_00315115;
    }
    if (2 < (int)VVar8) {
      (this->spxout).m_verbosity = INFO1;
      soplex::operator<<(local_150,"Primal feasible.  Optimizing again.\n");
      (this->spxout).m_verbosity = VVar8;
    }
    bVar9 = bVar4 ^ 1;
LAB_00314ee3:
    bVar4 = _isSolveStopped(this,&stoppedTime,&stoppedIter);
    if (bVar4) goto LAB_00315115;
  }
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::SolBase(&solUnbounded);
  this->_certificateMode = 2;
  _performUnboundedIRStable(this,&solUnbounded,&hasUnboundedRay,&stoppedTime,&stoppedIter,&error);
  if (error == true) {
    VVar8 = (this->spxout).m_verbosity;
    SVar7 = ERROR;
    if (2 < (int)VVar8) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Error while testing for unboundedness.\n",0x27);
      SVar7 = ERROR;
      goto LAB_003150fc;
    }
  }
  else {
    VVar8 = (this->spxout).m_verbosity;
    if (hasUnboundedRay == true) {
      if (2 < (int)VVar8) {
        (this->spxout).m_verbosity = INFO1;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((this->spxout).m_streams[3],"Dual infeasible.  Primal unbounded ray available.\n"
                   ,0x32);
LAB_00314d32:
        (this->spxout).m_verbosity = VVar8;
      }
    }
    else if (2 < (int)VVar8) {
      (this->spxout).m_verbosity = INFO1;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[3],"Dual feasible.  Rejecting primal unboundedness.\n",
                 0x30);
      goto LAB_00314d32;
    }
    bVar4 = hasUnboundedRay;
    SVar7 = ABORT_TIME;
    if (stoppedTime == false) {
      if (stoppedIter == false) {
        this->_certificateMode = 1;
        _performFeasIRStable(this,sol,&infeasible,&stoppedTime,&stoppedIter,&error);
        if (hasUnboundedRay == true) {
          VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
          ::operator=(local_140,&solUnbounded._primalRay);
          puVar2 = &(this->_solRational).field_0xd0;
          *puVar2 = *puVar2 | 2;
        }
        if (error == true) {
          VVar8 = (this->spxout).m_verbosity;
          SVar7 = ERROR;
          if (2 < (int)VVar8) {
            (this->spxout).m_verbosity = INFO1;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((this->spxout).m_streams[3],"Error while testing for feasibility.\n",0x25);
            SVar7 = ERROR;
            goto LAB_003150fc;
          }
        }
        else if ((stoppedTime == false) && (SVar7 = ABORT_ITER, stoppedIter == false)) {
          if (infeasible == true) {
            VVar8 = (this->spxout).m_verbosity;
            SVar7 = INFEASIBLE;
            if (2 < (int)VVar8) {
              (this->spxout).m_verbosity = INFO1;
              soplex::operator<<(local_150,"Primal infeasible.  Dual Farkas ray available.\n");
              SVar7 = INFEASIBLE;
LAB_003150fc:
              (this->spxout).m_verbosity = VVar8;
            }
          }
          else {
            VVar8 = (this->spxout).m_verbosity;
            if (hasUnboundedRay != true) {
              if (2 < (int)VVar8) {
                (this->spxout).m_verbosity = INFO1;
                soplex::operator<<(local_150,"Primal feasible and bounded.\n");
                (this->spxout).m_verbosity = VVar8;
              }
              bVar10 = bVar4 ^ 1;
              SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
              ::~SolBase(&solUnbounded);
              sol = local_138;
              goto LAB_00314ee3;
            }
            SVar7 = UNBOUNDED;
            if (2 < (int)VVar8) {
              (this->spxout).m_verbosity = INFO1;
              soplex::operator<<(local_150,"Primal feasible and unbounded.\n");
              SVar7 = UNBOUNDED;
              goto LAB_003150fc;
            }
          }
        }
      }
      else {
        SVar7 = ABORT_ITER;
      }
    }
  }
  this->_status = SVar7;
  SolBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
  ::~SolBase(&solUnbounded);
  sol = local_138;
LAB_00315115:
  pSVar1 = local_120;
  this->_switchedToBoosted = false;
  this->_hasOldBasis = false;
  this->_hasOldFeasBasis = false;
  this->_hasOldUnbdBasis = false;
  if ((uint)(this->_status + RUNNING) < 3) {
    this->_hasSolRational = true;
  }
  if (this->_currentSettings->_boolParamValues[1] == true) {
    _untransformEquality(this,sol);
  }
  if (((local_144 < 3) && (DAT_006aa534 <= (int)local_144)) && ((int)local_144 <= DAT_006aa5a4)) {
    this->_currentSettings->_intParamValues[1] = local_144;
  }
  setIntParam(this,RATIOTESTER,local_148,true);
  if (this->_currentSettings->_boolParamValues[0] == true) {
    _project(this,sol);
  }
  _restoreLPReal(this);
  if (this->_hasBasis != true) goto LAB_0031523a;
  SPxSolverBase<double>::setBasis
            (pSVar1,(this->_basisStatusRows).data,(this->_basisStatusCols).data);
  SVar3 = (this->_solver).super_SPxBasisBase<double>.thestatus;
  this->_hasBasis = NO_PROBLEM < SVar3;
  SVar7 = this->_status;
  if (SVar7 == INFEASIBLE) {
    if ((this->_solver).m_status == OPTIMAL) {
      (this->_solver).m_status = UNKNOWN;
    }
    SVar6 = INFEASIBLE;
    if (SVar3 == INFEASIBLE) goto LAB_0031523a;
  }
  else if (SVar7 == UNBOUNDED) {
    if ((this->_solver).m_status == OPTIMAL) {
      (this->_solver).m_status = UNKNOWN;
    }
    SVar6 = UNBOUNDED;
    if (SVar3 == UNBOUNDED) goto LAB_0031523a;
  }
  else {
    if (SVar7 != OPTIMAL) goto LAB_0031523a;
    if ((this->_solver).m_status == OPTIMAL) {
      (this->_solver).m_status = UNKNOWN;
    }
    SVar6 = OPTIMAL;
    if (SVar3 == OPTIMAL) goto LAB_0031523a;
  }
  (this->_solver).super_SPxBasisBase<double>.thestatus = SVar6;
LAB_0031523a:
  (*this->_statistics->initialPrecisionTime->_vptr_Timer[4])();
  (*this->_statistics->extendedPrecisionTime->_vptr_Timer[4])();
  (*this->_statistics->solvingTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SoPlexBase<R>::_optimizeRational(volatile bool* interrupt)
{
#ifndef SOPLEX_WITH_BOOST
   SPX_MSG_ERROR(std::cerr << "ERROR: rational solve without Boost not defined!" << std::endl;)
   return;
#else
   bool hasUnboundedRay = false;
   bool infeasibilityNotCertified = false;
   bool unboundednessNotCertified = false;

   // start timing
   _statistics->solvingTime->start();
   _statistics->preprocessingTime->start();
   _statistics->initialPrecisionTime->start();

   // remember that last solve was rational
   _lastSolveMode = SOLVEMODE_RATIONAL;
   _resetBoostedPrecision();

   // ensure that the solver has the original problemo
   if(!_isRealLPLoaded)
   {
      assert(_realLP != &_solver);

      _solver.loadLP(*_realLP);
      spx_free(_realLP);
      _realLP = &_solver;
      _isRealLPLoaded = true;
   }
   // during the rational solve, we always store basis information in the basis arrays
   else if(_hasBasis)
   {
      _basisStatusRows.reSize(numRows());
      _basisStatusCols.reSize(numCols());
      _solver.getBasis(_basisStatusRows.get_ptr(), _basisStatusCols.get_ptr(), _basisStatusRows.size(),
                       _basisStatusCols.size());
   }

   // store objective, bounds, and sides of Real LP in case they will be modified during iterative refinement
   _storeLPReal();

   // deactivate objective limit in floating-point solver
   if(realParam(SoPlexBase<R>::OBJLIMIT_LOWER) > -realParam(SoPlexBase<R>::INFTY)
         || realParam(SoPlexBase<R>::OBJLIMIT_UPPER) < realParam(SoPlexBase<R>::INFTY))
   {
      SPX_MSG_INFO2(spxout, spxout << "Deactivating objective limit.\n");
   }

   _solver.setTerminationValue(realParam(SoPlexBase<R>::INFTY));

   _statistics->preprocessingTime->stop();

   // apply lifting to reduce range of nonzero matrix coefficients
   if(boolParam(SoPlexBase<R>::LIFTING))
      _lift();

   // force column representation
   ///@todo implement row objectives with row representation
   int oldRepresentation = intParam(SoPlexBase<R>::REPRESENTATION);
   setIntParam(SoPlexBase<R>::REPRESENTATION, SoPlexBase<R>::REPRESENTATION_COLUMN);

   // force ratio test (avoid bound flipping)
   int oldRatiotester = intParam(SoPlexBase<R>::RATIOTESTER);

   if(oldRatiotester == SoPlexBase<R>::RATIOTESTER_BOUNDFLIPPING)
      setIntParam(SoPlexBase<R>::RATIOTESTER, SoPlexBase<R>::RATIOTESTER_FAST);

   ///@todo implement handling of row objectives in Cplex interface
#ifdef SOPLEX_WITH_CPX
   int oldEqtrans = boolParam(SoPlexBase<R>::EQTRANS);
   setBoolParam(SoPlexBase<R>::EQTRANS, true);
#endif

   // introduce slack variables to transform inequality constraints into equations
   if(boolParam(SoPlexBase<R>::EQTRANS))
      _transformEquality();

   _storedBasis = false;

   bool stoppedTime;
   bool stoppedIter;

   do
   {
      bool primalFeasible = false;
      bool dualFeasible = false;
      bool infeasible = false;
      bool unbounded = false;
      bool error = false;
      stoppedTime = false;
      stoppedIter = false;

      // indicate we are solving the original LP
      _switchToStandardMode();

      /// solve problem with iterative refinement and the right precision
      _performOptIRWrapper(_solRational, !unboundednessNotCertified, !infeasibilityNotCertified, 0,
                           primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error);

#ifdef SOPLEX_WITH_MPFR

      // case: an unrecoverable error occured, and precision boosting has reached its limit
      if(error && _boostingLimitReached)
      {
         _status = SPxSolverBase<R>::ERROR;
         break;
      }
      // case: an error occured, boost precision
      else if(error)
#else

      // case: an unrecoverable error occured, boost precision
      if(error)
#endif
      {
         _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

         if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
         {
            if(_setupBoostedSolverAfterRecovery())
               continue;
            else // precision boosting has reached its limit
               break;
         }
         else
            break;

#else
         break;
#endif
      }
      // case: stopped due to some limit
      else if(stoppedTime)
      {
         _status = SPxSolverBase<R>::ABORT_TIME;
         break;
      }
      else if(stoppedIter)
      {
         _status = SPxSolverBase<R>::ABORT_ITER;
         break;
      }
      // case: unboundedness detected for the first time
      else if(unbounded && !unboundednessNotCertified)
      {
         SolRational solUnbounded;

         // indicate we are testing unboundedness
         _switchToUnbdMode();

         _performUnboundedIRStable(solUnbounded, hasUnboundedRay, stoppedTime, stoppedIter, error);

         assert(!hasUnboundedRay || solUnbounded.hasPrimalRay());
         assert(!solUnbounded.hasPrimalRay() || hasUnboundedRay);

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for unboundedness.\n");
            _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }

         if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Dual infeasible.  Primal unbounded ray available.\n");
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Dual feasible.  Rejecting primal unboundedness.\n");
         }

         unboundednessNotCertified = !hasUnboundedRay;

         if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            break;
         }

         // indicate we are testing feasibility
         _switchToFeasMode();

         _performFeasIRStable(_solRational, infeasible, stoppedTime, stoppedIter, error);

         ///@todo this should be stored already earlier, possible switch use solRational above and solFeas here
         if(hasUnboundedRay)
         {
            _solRational._primalRay = solUnbounded._primalRay;
            _solRational._hasPrimalRay = true;
         }

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for feasibility.\n");
            _status = SPxSolverBase<R>::ERROR;
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }
         else if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            break;
         }
         else if(infeasible)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal infeasible.  Dual Farkas ray available.\n");
            _status = SPxSolverBase<R>::INFEASIBLE;
            break;
         }
         else if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and unbounded.\n");
            _status = SPxSolverBase<R>::UNBOUNDED;
            break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and bounded.\n");
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }

#endif
            continue;
         }
      }
      // case: infeasibility detected
      else if(infeasible && !infeasibilityNotCertified)
      {
         _storeBasis();

         // indicate we are testing feasibility
         _switchToFeasMode();

         _performFeasIRStable(_solRational, infeasible, stoppedTime, stoppedIter, error);

         if(error)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error while testing for infeasibility.\n");
            _status = SPxSolverBase<R>::ERROR;
            _restoreBasis();
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }
            else
               break;

#else
            break;
#endif
         }

         infeasibilityNotCertified = !infeasible;

         if(stoppedTime)
         {
            _status = SPxSolverBase<R>::ABORT_TIME;
            _restoreBasis();
            break;
         }
         else if(stoppedIter)
         {
            _status = SPxSolverBase<R>::ABORT_ITER;
            _restoreBasis();
            break;
         }

         if(infeasible && boolParam(SoPlexBase<R>::TESTDUALINF))
         {
            SolRational solUnbounded;

            // indicate we are testing unboundedness
            // not sure about this.
            _switchToUnbdMode();

            _performUnboundedIRStable(solUnbounded, hasUnboundedRay, stoppedTime, stoppedIter, error);

            assert(!hasUnboundedRay || solUnbounded.hasPrimalRay());
            assert(!solUnbounded.hasPrimalRay() || hasUnboundedRay);

            if(error)
            {
               SPX_MSG_INFO1(spxout, spxout << "Error while testing for dual infeasibility.\n");
               _status = SPxSolverBase<R>::ERROR;
               _restoreBasis();
#ifdef SOPLEX_WITH_MPFR

               if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
               {
                  if(_setupBoostedSolverAfterRecovery())
                     continue;
                  else // precision boosting has reached its limit
                     break;
               }
               else
                  break;

#else
               break;
#endif
            }

            if(hasUnboundedRay)
            {
               SPX_MSG_INFO1(spxout, spxout << "Dual infeasible.  Primal unbounded ray available.\n");
               _solRational._primalRay = solUnbounded._primalRay;
               _solRational._hasPrimalRay = true;
            }
            else if(solUnbounded._isDualFeasible)
            {
               SPX_MSG_INFO1(spxout, spxout << "Dual feasible.  Storing dual multipliers.\n");
               _solRational._dual = solUnbounded._dual;
               _solRational._redCost = solUnbounded._redCost;
               _solRational._isDualFeasible = true;
            }
            else
            {
               assert(false);
               SPX_MSG_INFO1(spxout, spxout << "Not dual infeasible.\n");
            }
         }

         _restoreBasis();

         if(infeasible)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal infeasible.  Dual Farkas ray available.\n");
            _status = SPxSolverBase<R>::INFEASIBLE;
            break;
         }
         else if(hasUnboundedRay)
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible and unbounded.\n");
            _status = SPxSolverBase<R>::UNBOUNDED;
            break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Primal feasible.  Optimizing again.\n");
#ifdef SOPLEX_WITH_MPFR

            if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
            {
               if(_setupBoostedSolverAfterRecovery())
                  continue;
               else // precision boosting has reached its limit
                  break;
            }

#endif
            continue;
         }
      }
      else if(primalFeasible && dualFeasible)
      {
         SPX_MSG_INFO1(spxout, spxout << "Solved to optimality.\n");
         _status = SPxSolverBase<R>::OPTIMAL;
         break;
      }
      else
      {
#ifdef SOPLEX_WITH_MPFR

         if(boolParam(SoPlexBase<R>::PRECISION_BOOSTING))
         {
            if(_setupBoostedSolverAfterRecovery())
               continue;
            else // precision boosting has reached its limit
               break;
         }
         else
         {
            SPX_MSG_INFO1(spxout, spxout << "Terminating without success.\n");
            break;
         }

#else
         SPX_MSG_INFO1(spxout, spxout << "Terminating without success.\n");
         break;
#endif
      }
   }
   while(!_isSolveStopped(stoppedTime, stoppedIter));

   // reset old basis flags for future optimization runs
   _switchedToBoosted = false;
   _hasOldBasis = false;
   _hasOldFeasBasis = false;
   _hasOldUnbdBasis = false;

   ///@todo set status to ABORT_VALUE if optimal solution exceeds objective limit

   if(_status == SPxSolverBase<R>::OPTIMAL || _status == SPxSolverBase<R>::INFEASIBLE
         || _status == SPxSolverBase<R>::UNBOUNDED)
      _hasSolRational = true;

   // restore original problem
   if(boolParam(SoPlexBase<R>::EQTRANS))
      _untransformEquality(_solRational);

#ifdef SOPLEX_WITH_CPX
   setBoolParam(SoPlexBase<R>::EQTRANS, oldEqtrans);
#endif

   // reset representation and ratio test
   setIntParam(SoPlexBase<R>::REPRESENTATION, oldRepresentation);
   setIntParam(SoPlexBase<R>::RATIOTESTER, oldRatiotester);

   // undo lifting
   if(boolParam(SoPlexBase<R>::LIFTING))
      _project(_solRational);

   // restore objective, bounds, and sides of Real LP in case they have been modified during iterative refinement
   _restoreLPReal();

   // since the Real LP is loaded in the solver, we need to also pass the basis information to the solver if
   // available
   if(_hasBasis)
   {
      assert(_isRealLPLoaded);
      _solver.setBasis(_basisStatusRows.get_const_ptr(), _basisStatusCols.get_const_ptr());
      _hasBasis = (_solver.basis().status() > SPxBasisBase<R>::NO_PROBLEM);

      // since setBasis always sets the basis status to regular, we need to set it manually here
      switch(_status)
      {
      case SPxSolverBase<R>::OPTIMAL:
         _solver.setBasisStatus(SPxBasisBase<R>::OPTIMAL);
         break;

      case SPxSolverBase<R>::INFEASIBLE:
         _solver.setBasisStatus(SPxBasisBase<R>::INFEASIBLE);
         break;

      case SPxSolverBase<R>::UNBOUNDED:
         _solver.setBasisStatus(SPxBasisBase<R>::UNBOUNDED);
         break;

      default:
         break;
      }

   }

   // stop timing
   _statistics->initialPrecisionTime->stop();
   _statistics->extendedPrecisionTime->stop();
   _statistics->solvingTime->stop();
#endif
}

/// perform iterative refinement using the right precision
template <class R>
void SoPlexBase<R>::_performOptIRWrapper(
   SolRational& sol,
   bool acceptUnbounded,
   bool acceptInfeasible,
   int minIRRoundsRemaining,
   bool& primalFeasible,
   bool& dualFeasible,
   bool& infeasible,
   bool& unbounded,
   bool& stoppedTime,
   bool& stoppedIter,
   bool& error
)
{
   _solver.setSolvingForBoosted(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));
   _boostedSolver.setSolvingForBoosted(boolParam(SoPlexBase<R>::PRECISION_BOOSTING));

#ifdef SOPLEX_WITH_MPFR

   if(boolParam(SoPlexBase<R>::ITERATIVE_REFINEMENT))
   {
      // no precision boosting or initial precision -> solve with plain iterative refinement
      if(!boolParam(SoPlexBase<R>::PRECISION_BOOSTING) || !_switchedToBoosted)
      {
         _performOptIRStable(sol, acceptUnbounded, acceptInfeasible, minIRRoundsRemaining,
                             primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error);
      }
      else
      {
         do
         {
            // setup boosted solver for the new iteration
            _setupBoostedSolver();
            // solve problem with iterative refinement and recovery mechanism, using multiprecision
            // return false if a new boosted iteration is needed, true otherwise
            bool needNewBoostedIt;
            _performOptIRStableBoosted(sol, acceptUnbounded, acceptInfeasible, minIRRoundsRemaining,
                                       primalFeasible, dualFeasible, infeasible, unbounded, stoppedTime, stoppedIter, error,
                                       needNewBoostedIt);

            // update statistics for precision boosting
            _updateBoostingStatistics();

            // boost precision if no success
            if(needNewBoostedIt)
            {
               if(!_boostPrecision())
               {
                  // error message already displayed
                  error = true;
                  break;
               }
            }
            else
               break;
         }
         while(true);
      }